

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_InternalSessionCache_Test::TestBody
          (SSLTest_InternalSessionCache_Test *this)

{
  pointer *this_00;
  undefined1 auVar1 [16];
  UniquePtr<SSL_CTX> UVar2;
  pointer puVar3;
  int iVar4;
  SSL_METHOD *meth;
  pointer puVar5;
  uint32_t number;
  UniquePtr<SSL_SESSION> *this_01;
  long *plVar6;
  char *in_R9;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *puVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  initializer_list<ssl_session_st_*> __l;
  initializer_list<ssl_session_st_*> __l_00;
  initializer_list<ssl_session_st_*> __l_01;
  initializer_list<ssl_session_st_*> __l_02;
  initializer_list<ssl_session_st_*> __l_03;
  AssertHelper AStack_a8;
  UniquePtr<SSL_SESSION> collision;
  UniquePtr<SSL_SESSION> session;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  AssertionResult gtest_ar__1;
  UniquePtr<SSL_CTX> ctx;
  string local_68;
  ssl_session_st *local_48;
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  sessions;
  
  meth = (SSL_METHOD *)TLS_method();
  ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  this_00 = &sessions.
             super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ =
       (int7)((ulong)sessions.
                     super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 8);
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ =
       (tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
       ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0;
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((tuple<ssl_ctx_st_*,_bssl::internal::Deleter>)
      ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ssl_ctx_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&sessions,(AssertionResult *)0x2f5309,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&session,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa66,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&session,(Message *)&gtest_ar__1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&session);
    std::__cxx11::string::~string((string *)&local_68);
    if ((long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_) + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    goto LAB_0016425c;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)this_00);
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sessions.
  super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (number = 0; number != 10; number = number + 1) {
    CreateTestSession((anon_unknown_0 *)&session,number);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    bVar8 = CONCAT71(session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._1_7_,
                     (char)session._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl) == 0;
    gtest_ar__1.success_ = !bVar8;
    if (bVar8) {
      testing::Message::Message((Message *)&collision);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)&gtest_ar__1,(AssertionResult *)0x30d804,"false","true",in_R9
                );
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa6c,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&collision);
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      std::__cxx11::string::~string((string *)&local_68);
      if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
          collision._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
        (**(code **)(*(long *)collision._M_t.
                              super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      this_01 = &session;
      goto LAB_00164048;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    std::
    vector<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>,std::allocator<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>>
    ::emplace_back<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
              ((vector<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>,std::allocator<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>>
                *)&sessions,(unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&session);
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&session);
  }
  SSL_CTX_sess_set_cache_size
            ((SSL_CTX *)
             ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,5);
  puVar3 = sessions.
           super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = sessions.
                super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      UVar2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
           ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl, puVar5 != puVar3;
      puVar5 = puVar5 + 1) {
    iVar4 = SSL_CTX_add_session((SSL_CTX *)
                                ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                (SSL_SESSION *)
                                (puVar5->_M_t).
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar4 != 0;
    if (iVar4 == 0) {
      testing::Message::Message((Message *)&session);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)&gtest_ar__1,
                 (AssertionResult *)"SSL_CTX_add_session(ctx.get(), session.get())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&collision,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa74,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&collision,(Message *)&session);
      goto LAB_001641b0;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
  }
  auVar1 = *(undefined1 (*) [16])
            (sessions.
             super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 8);
  auVar9._0_8_ = auVar1._8_8_;
  auVar9._8_4_ = auVar1._0_4_;
  auVar9._12_4_ = auVar1._4_4_;
  local_68._M_string_length = auVar9._8_8_;
  auVar1 = *(undefined1 (*) [16])
            (sessions.
             super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 6);
  auVar10._0_8_ = auVar1._8_8_;
  auVar10._8_4_ = auVar1._0_4_;
  auVar10._12_4_ = auVar1._4_4_;
  local_68.field_2._8_8_ = auVar10._8_8_;
  local_48 = sessions.
             super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
             ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  local_68._M_dataplus._M_p = (pointer)auVar9._0_8_;
  local_68.field_2._M_allocated_capacity = auVar10._0_8_;
  std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
            ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1,__l,
             (allocator_type *)&collision);
  session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_ =
       CacheEquals((SSL_CTX *)
                   UVar2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                   super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                   super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                   (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
  local_90._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base
            ((_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
  if ((char)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == '\0') {
    testing::Message::Message((Message *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)&session,
               (AssertionResult *)
               "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&collision,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0xa7a,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&collision,(Message *)&gtest_ar__1);
LAB_00164226:
    puVar7 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_90;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&collision);
    std::__cxx11::string::~string((string *)&local_68);
    plVar6 = (long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
LAB_0016423f:
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(puVar7);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_90);
    iVar4 = SSL_CTX_add_session((SSL_CTX *)
                                ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                                _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                (SSL_SESSION *)
                                sessions.
                                super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ = iVar4 == 0;
    if (!gtest_ar__1.success_) {
      testing::Message::Message((Message *)&session);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)&gtest_ar__1,
                 (AssertionResult *)"SSL_CTX_add_session(ctx.get(), sessions[7].get())","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&collision,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa7e,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&collision,(Message *)&session);
LAB_001641b0:
      puVar7 = &gtest_ar__1.message_;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&collision);
      std::__cxx11::string::~string((string *)&local_68);
      plVar6 = (long *)CONCAT71(session._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._1_7_,
                                (char)session._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      goto LAB_0016423f;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    UVar2 = ctx;
    auVar1 = *(undefined1 (*) [16])
              (sessions.
               super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 8);
    auVar11._0_8_ = auVar1._8_8_;
    auVar11._8_4_ = auVar1._0_4_;
    auVar11._12_4_ = auVar1._4_4_;
    local_68._M_string_length = auVar11._8_8_;
    auVar1 = *(undefined1 (*) [16])
              (sessions.
               super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 6);
    auVar12._0_8_ = auVar1._8_8_;
    auVar12._8_4_ = auVar1._0_4_;
    auVar12._12_4_ = auVar1._4_4_;
    local_68.field_2._8_8_ = auVar12._8_8_;
    local_48 = sessions.
               super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
               ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
               super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    __l_00._M_len = 5;
    __l_00._M_array = (iterator)&local_68;
    local_68._M_dataplus._M_p = (pointer)auVar11._0_8_;
    local_68.field_2._M_allocated_capacity = auVar12._0_8_;
    std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
              ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1,__l_00,
               (allocator_type *)&collision);
    session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_ =
         CacheEquals((SSL_CTX *)
                     UVar2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
    local_90._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base
              ((_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
    if ((char)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == '\0') {
      testing::Message::Message((Message *)&gtest_ar__1);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)&session,
                 (AssertionResult *)
                 "CacheEquals( ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(), sessions[6].get(), sessions[5].get()})"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&collision,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa81,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=((AssertHelper *)&collision,(Message *)&gtest_ar__1)
      ;
      goto LAB_00164226;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_90);
    CreateTestSession((anon_unknown_0 *)&collision,7);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__1.success_ =
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
         collision._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)
        collision._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&session);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_68,(internal *)&gtest_ar__1,(AssertionResult *)"collision","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xa86,local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&session);
LAB_001646c6:
      puVar7 = &gtest_ar__1.message_;
      testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
      std::__cxx11::string::~string((string *)&local_68);
      plVar6 = (long *)CONCAT71(session._M_t.
                                super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._1_7_,
                                (char)session._M_t.
                                      super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                      .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
LAB_0016474d:
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 8))();
      }
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      iVar4 = SSL_CTX_add_session((SSL_CTX *)
                                  ctx._M_t.
                                  super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                                  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                                  (SSL_SESSION *)
                                  collision._M_t.
                                  super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar4 != 0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&session);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&gtest_ar__1,
                   (AssertionResult *)"SSL_CTX_add_session(ctx.get(), collision.get())","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa87,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&session);
        goto LAB_001646c6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      UVar2 = ctx;
      local_68._M_dataplus._M_p =
           (pointer)collision._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      auVar1 = *(undefined1 (*) [16])
                (sessions.
                 super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 8);
      auVar13._0_8_ = auVar1._8_8_;
      auVar13._8_4_ = auVar1._0_4_;
      auVar13._12_4_ = auVar1._4_4_;
      local_68.field_2._M_allocated_capacity = auVar13._8_8_;
      auVar1 = *(undefined1 (*) [16])
                (sessions.
                 super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 5);
      auVar14._0_8_ = auVar1._8_8_;
      auVar14._8_4_ = auVar1._0_4_;
      auVar14._12_4_ = auVar1._4_4_;
      local_48 = auVar14._8_8_;
      __l_01._M_len = 5;
      __l_01._M_array = (iterator)&local_68;
      local_68._M_string_length = auVar13._0_8_;
      local_68.field_2._8_8_ = auVar14._0_8_;
      std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1,__l_01,
                 (allocator_type *)&AStack_a8);
      session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_ =
           CacheEquals((SSL_CTX *)
                       UVar2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
      local_90._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base
                ((_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
      if ((char)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == '\0') {
        testing::Message::Message((Message *)&gtest_ar__1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&session,
                   (AssertionResult *)
                   "CacheEquals( ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[6].get(), sessions[5].get()})"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa8a,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar__1);
LAB_00164736:
        puVar7 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_90;
        testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
        std::__cxx11::string::~string((string *)&local_68);
        plVar6 = (long *)CONCAT71(gtest_ar__1._1_7_,gtest_ar__1.success_);
        goto LAB_0016474d;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_90);
      iVar4 = SSL_CTX_remove_session
                        ((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         (SSL_SESSION *)
                         sessions.
                         super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[6]._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar4 != 0;
      if (iVar4 == 0) {
        testing::Message::Message((Message *)&session);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&gtest_ar__1,
                   (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[6].get())","false"
                   ,"true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa8d,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&session);
        goto LAB_001646c6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      UVar2 = ctx;
      local_68._M_dataplus._M_p =
           (pointer)collision._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      auVar1 = *(undefined1 (*) [16])
                (sessions.
                 super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 8);
      auVar15._0_8_ = auVar1._8_8_;
      auVar15._8_4_ = auVar1._0_4_;
      auVar15._12_4_ = auVar1._4_4_;
      local_68.field_2._M_allocated_capacity = auVar15._8_8_;
      local_68.field_2._8_8_ =
           sessions.
           super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      __l_02._M_len = 4;
      __l_02._M_array = (iterator)&local_68;
      local_68._M_string_length = auVar15._0_8_;
      std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1,__l_02,
                 (allocator_type *)&AStack_a8);
      session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_ =
           CacheEquals((SSL_CTX *)
                       UVar2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                       (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
      local_90._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base
                ((_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
      if ((char)session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl == '\0') {
        testing::Message::Message((Message *)&gtest_ar__1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&session,
                   (AssertionResult *)
                   "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa8f,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar__1);
        goto LAB_00164736;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_90);
      iVar4 = SSL_CTX_remove_session
                        ((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         (SSL_SESSION *)
                         ((sessions.
                           super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar4 == 0;
      if (!gtest_ar__1.success_) {
        testing::Message::Message((Message *)&session);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&gtest_ar__1,
                   (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[0].get())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa92,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&session);
        goto LAB_001646c6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      iVar4 = SSL_CTX_remove_session
                        ((SSL_CTX *)
                         ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                         (SSL_SESSION *)
                         sessions.
                         super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[7]._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__1.success_ = iVar4 == 0;
      if (!gtest_ar__1.success_) {
        testing::Message::Message((Message *)&session);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&gtest_ar__1,
                   (AssertionResult *)"SSL_CTX_remove_session(ctx.get(), sessions[7].get())","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa93,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&session);
        goto LAB_001646c6;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      UVar2 = ctx;
      local_68._M_dataplus._M_p =
           (pointer)collision._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>.
                    _M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      auVar1 = *(undefined1 (*) [16])
                (sessions.
                 super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 8);
      auVar16._0_8_ = auVar1._8_8_;
      auVar16._8_4_ = auVar1._0_4_;
      auVar16._12_4_ = auVar1._4_4_;
      local_68.field_2._M_allocated_capacity = auVar16._8_8_;
      local_68.field_2._8_8_ =
           sessions.
           super__Vector_base<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5]._M_t.
           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
      __l_03._M_len = 4;
      __l_03._M_array = (iterator)&local_68;
      local_68._M_string_length = auVar16._0_8_;
      std::vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::vector
                ((vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1,__l_03,
                 (allocator_type *)&AStack_a8);
      bVar8 = CacheEquals((SSL_CTX *)
                          UVar2._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                          .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                          (vector<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)
                          &gtest_ar__1);
      puVar7 = (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_90;
      local_90._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )(_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl._0_1_ = bVar8;
      std::_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_>::~_Vector_base
                ((_Vector_base<ssl_session_st_*,_std::allocator<ssl_session_st_*>_> *)&gtest_ar__1);
      if (!bVar8) {
        testing::Message::Message((Message *)&gtest_ar__1);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_68,(internal *)&session,
                   (AssertionResult *)
                   "CacheEquals(ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(), sessions[5].get()})"
                   ,"false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_a8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xa97,local_68._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&gtest_ar__1);
        goto LAB_00164736;
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(puVar7);
    this_01 = &collision;
LAB_00164048:
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(this_01);
  }
  std::
  vector<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>,_std::allocator<std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>_>_>
  ::~vector(&sessions);
LAB_0016425c:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&ctx);
  return;
}

Assistant:

TEST(SSLTest, InternalSessionCache) {
  bssl::UniquePtr<SSL_CTX> ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(ctx);

  // Prepare 10 test sessions.
  std::vector<bssl::UniquePtr<SSL_SESSION>> sessions;
  for (int i = 0; i < 10; i++) {
    bssl::UniquePtr<SSL_SESSION> session = CreateTestSession(i);
    ASSERT_TRUE(session);
    sessions.push_back(std::move(session));
  }

  SSL_CTX_sess_set_cache_size(ctx.get(), 5);

  // Insert all the test sessions.
  for (const auto &session : sessions) {
    ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), session.get()));
  }

  // Only the last five should be in the list.
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Inserting an element already in the cache should fail and leave the cache
  // unchanged.
  ASSERT_FALSE(SSL_CTX_add_session(ctx.get(), sessions[7].get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {sessions[9].get(), sessions[8].get(), sessions[7].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Although collisions should be impossible (256-bit session IDs), the cache
  // must handle them gracefully.
  bssl::UniquePtr<SSL_SESSION> collision(CreateTestSession(7));
  ASSERT_TRUE(collision);
  ASSERT_TRUE(SSL_CTX_add_session(ctx.get(), collision.get()));
  ASSERT_TRUE(CacheEquals(
      ctx.get(), {collision.get(), sessions[9].get(), sessions[8].get(),
                  sessions[6].get(), sessions[5].get()}));

  // Removing sessions behaves correctly.
  ASSERT_TRUE(SSL_CTX_remove_session(ctx.get(), sessions[6].get()));
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));

  // Removing sessions requires an exact match.
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[0].get()));
  ASSERT_FALSE(SSL_CTX_remove_session(ctx.get(), sessions[7].get()));

  // The cache remains unchanged.
  ASSERT_TRUE(CacheEquals(ctx.get(), {collision.get(), sessions[9].get(),
                                      sessions[8].get(), sessions[5].get()}));
}